

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::ComplainAboutBadComponent
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg,int c,bool strong)

{
  int iVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType targetType;
  ostream *poVar3;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  reference piVar4;
  reference ppcVar5;
  string *psVar6;
  char *pcVar7;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_04;
  const_reference pvVar8;
  string local_240;
  cmGeneratorTarget *local_220;
  cmGeneratorTarget *dependee;
  reference pcStack_210;
  int j;
  cmGraphEdge *ni;
  const_iterator __end2;
  const_iterator __begin2;
  EdgeList *__range2;
  EdgeList *nl;
  cmGeneratorTarget *depender;
  const_iterator cStack_1d8;
  int i;
  const_iterator __end1;
  const_iterator __begin1;
  NodeList *__range1;
  NodeList *cl;
  vector<int,_std::allocator<int>_> *cmap;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  undefined1 local_198 [8];
  ostringstream e;
  bool strong_local;
  int c_local;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar3 = std::operator<<((ostream *)local_198,
                           "The inter-target dependency graph contains the following ");
  std::operator<<(poVar3,"strongly connected component (cycle):\n");
  this_01 = cmComputeComponentGraph::GetComponents(ccg);
  this_02 = cmComputeComponentGraph::GetComponentMap(ccg);
  this_03 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                       (this_01,(long)c)->super_vector<int,_std::allocator<int>_>;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this_03);
  cStack_1d8 = std::vector<int,_std::allocator<int>_>::end(this_03);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe28), bVar2) {
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    iVar1 = *piVar4;
    ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(long)iVar1);
    this_00 = *ppcVar5;
    poVar3 = std::operator<<((ostream *)local_198,"  \"");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
    poVar3 = std::operator<<(poVar3,(string *)psVar6);
    poVar3 = std::operator<<(poVar3,"\" of type ");
    targetType = cmGeneratorTarget::GetType(this_00);
    pcVar7 = cmState::GetTargetTypeName(targetType);
    poVar3 = std::operator<<(poVar3,pcVar7);
    std::operator<<(poVar3,"\n");
    this_04 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (&(this->InitialGraph).
                           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                          (long)iVar1)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    __end2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_04);
    ni = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_04);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                       *)&ni), bVar2) {
      pcStack_210 = __gnu_cxx::
                    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                    ::operator*(&__end2);
      dependee._4_4_ = cmGraphEdge::operator_cast_to_int(pcStack_210);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)dependee._4_4_);
      if (*pvVar8 == c) {
        ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::operator[](&this->Targets,(long)dependee._4_4_);
        local_220 = *ppcVar5;
        poVar3 = std::operator<<((ostream *)local_198,"    depends on \"");
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_220);
        poVar3 = std::operator<<(poVar3,(string *)psVar6);
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = std::operator<<(poVar3," (");
        bVar2 = cmGraphEdge::IsStrong(pcStack_210);
        pcVar7 = "weak";
        if (bVar2) {
          pcVar7 = "strong";
        }
        poVar3 = std::operator<<(poVar3,pcVar7);
        std::operator<<(poVar3,")\n");
      }
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  if (strong) {
    poVar3 = std::operator<<((ostream *)local_198,
                             "The component contains at least one cycle consisting of strong ");
    std::operator<<(poVar3,"dependencies (created by add_dependencies) that cannot be broken.");
  }
  else if ((this->NoCycles & 1U) == 0) {
    poVar3 = std::operator<<((ostream *)local_198,
                             "At least one of these targets is not a STATIC_LIBRARY.  ");
    std::operator<<(poVar3,"Cyclic dependencies are allowed only among static libraries.");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_198,
                             "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so ");
    std::operator<<(poVar3,"cyclic dependencies are not allowed even among static libraries.");
  }
  std::__cxx11::ostringstream::str();
  cmSystemTools::Error(&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return;
}

Assistant:

void cmComputeTargetDepends::ComplainAboutBadComponent(
  cmComputeComponentGraph const& ccg, int c, bool strong)
{
  // Construct the error message.
  std::ostringstream e;
  e << "The inter-target dependency graph contains the following "
    << "strongly connected component (cycle):\n";
  std::vector<NodeList> const& components = ccg.GetComponents();
  std::vector<int> const& cmap = ccg.GetComponentMap();
  NodeList const& cl = components[c];
  for (int i : cl) {
    // Get the depender.
    cmGeneratorTarget const* depender = this->Targets[i];

    // Describe the depender.
    e << "  \"" << depender->GetName() << "\" of type "
      << cmState::GetTargetTypeName(depender->GetType()) << "\n";

    // List its dependencies that are inside the component.
    EdgeList const& nl = this->InitialGraph[i];
    for (cmGraphEdge const& ni : nl) {
      int j = ni;
      if (cmap[j] == c) {
        cmGeneratorTarget const* dependee = this->Targets[j];
        e << "    depends on \"" << dependee->GetName() << "\""
          << " (" << (ni.IsStrong() ? "strong" : "weak") << ")\n";
      }
    }
  }
  if (strong) {
    // Custom command executable dependencies cannot occur within a
    // component of static libraries.  The cycle must appear in calls
    // to add_dependencies.
    e << "The component contains at least one cycle consisting of strong "
      << "dependencies (created by add_dependencies) that cannot be broken.";
  } else if (this->NoCycles) {
    e << "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so "
      << "cyclic dependencies are not allowed even among static libraries.";
  } else {
    e << "At least one of these targets is not a STATIC_LIBRARY.  "
      << "Cyclic dependencies are allowed only among static libraries.";
  }
  cmSystemTools::Error(e.str());
}